

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_opcode_dsss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  size_t in_RDX;
  char *pcVar3;
  undefined8 auStack_150 [3];
  char local_138 [8];
  char src1 [64];
  char src2 [64];
  char dst [64];
  char src0 [64];
  
  auStack_150[2] = 0x118e11;
  make_D3D_destarg_string(ctx,src2 + 0x38,in_RDX);
  auStack_150[2] = 0x118e2b;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args,dst + 0x38,0x40);
  auStack_150[2] = 0x118e47;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 1,local_138,0x40);
  auStack_150[2] = 0x118e63;
  make_D3D_srcarg_string_in_buf(ctx,ctx->source_args + 2,src1 + 0x38,0x40);
  auStack_150[2] = 0x118e6b;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)auStack_150 + lVar1 + 0x10) = 0x118e87;
  lowercase(local_138 + lVar1,opcode);
  pcVar3 = "+";
  if (ctx->coissue == 0) {
    pcVar3 = "";
  }
  *(char **)((long)auStack_150 + lVar1 + 0x10) = src1 + 0x38;
  *(char **)((long)auStack_150 + lVar1 + 8) = local_138;
  *(undefined8 *)((long)auStack_150 + lVar1) = 0x118ec3;
  output_line(ctx,"%s%s%s, %s, %s, %s",pcVar3,local_138 + lVar1,src2 + 0x38,dst + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_dsss(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_D3D_srcarg_string(ctx, 2, src2, sizeof (src2));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s, %s, %s", ctx->coissue ? "+" : "", 
                opcode, dst, src0, src1, src2);
}